

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conc_heter_queue.h
# Opt level: O1

Msg * __thiscall
density::conc_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
reentrant_consume_operation::
element<density_tests::conc_heterogeneous_queue_reentrant_put_transaction_samples()::Msg>
          (reentrant_consume_operation *this)

{
  runtime_type<> *prVar1;
  Msg *pMVar2;
  
  if (*(long *)(this + 0x10) != 0) {
    prVar1 = heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
             reentrant_consume_operation::complete_type((reentrant_consume_operation *)(this + 8));
    if (prVar1->m_feature_table ==
        (tuple_type *)
        detail::
        FeatureTable<std::tuple<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,density_tests::conc_heterogeneous_queue_reentrant_put_transaction_samples()::Msg>
        ::s_table) goto LAB_00a75c32;
  }
  density_tests::detail::assert_failed<>
            ("!empty() && complete_type().template is<COMPLETE_ELEMENT_TYPE>()",
             "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/heter_queue.h"
             ,0x7f3);
LAB_00a75c32:
  pMVar2 = (Msg *)heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
                  get_element(*(QueueControl **)(this + 0x10));
  return pMVar2;
}

Assistant:

COMPLETE_ELEMENT_TYPE & element() const noexcept
            {
                return m_consume_operation.template element<COMPLETE_ELEMENT_TYPE>();
            }